

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailCallStack(CWriter *this)

{
  Newline local_3b;
  Newline local_3a;
  Newline local_39;
  string local_38;
  Newline local_12;
  Newline local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  (anonymous_namespace)::CWriter::Write<char_const(&)[28],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [28])"void *instance_ptr_storage;",&local_11);
  (anonymous_namespace)::CWriter::Write<char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [45])"void **instance_ptr = &instance_ptr_storage;",&local_12
            );
  std::__cxx11::to_string(&local_38,0x400);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[22],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [22])"char tail_call_stack[",&local_38,(char (*) [3])0x37c959
             ,&local_39);
  std::__cxx11::string::~string((string *)&local_38);
  (anonymous_namespace)::CWriter::Write<char_const(&)[35],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [35])"wasm_rt_tailcallee_t next_storage;",&local_3a);
  (anonymous_namespace)::CWriter::Write<char_const(&)[44],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [44])"wasm_rt_tailcallee_t *next = &next_storage;",&local_3b)
  ;
  return;
}

Assistant:

void CWriter::WriteTailCallStack() {
  Write("void *instance_ptr_storage;", Newline());
  Write("void **instance_ptr = &instance_ptr_storage;", Newline());
  Write("char tail_call_stack[", std::to_string(kTailCallStackSize), "];",
        Newline());
  Write("wasm_rt_tailcallee_t next_storage;", Newline());
  Write("wasm_rt_tailcallee_t *next = &next_storage;", Newline());
}